

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *jp2,OPJ_BYTE *p_colr_header_data,OPJ_UINT32 p_colr_header_size
                          ,opj_event_mgr_t *p_manager)

{
  int iVar1;
  void *pvVar2;
  int local_60;
  OPJ_INT32 icc_len;
  OPJ_INT32 it_icc_value;
  OPJ_UINT32 il;
  OPJ_UINT32 ob;
  OPJ_UINT32 rb;
  OPJ_UINT32 oa;
  OPJ_UINT32 ra;
  OPJ_UINT32 ol;
  OPJ_UINT32 rl;
  OPJ_UINT32 *cielab;
  opj_event_mgr_t *poStack_30;
  OPJ_UINT32 l_value;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_colr_header_size_local;
  OPJ_BYTE *p_colr_header_data_local;
  opj_jp2_t *jp2_local;
  
  poStack_30 = p_manager;
  p_manager_local._4_4_ = p_colr_header_size;
  pOStack_20 = p_colr_header_data;
  p_colr_header_data_local = (OPJ_BYTE *)jp2;
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x5bb,
                  "OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_colr_header_data != (OPJ_BYTE *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x5bd,
                    "OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    if (p_colr_header_size < 3) {
      opj_event_msg(p_manager,1,"Bad COLR header box (bad size)\n");
      jp2_local._4_4_ = 0;
    }
    else if ((jp2->color).jp2_has_colr == '\0') {
      opj_read_bytes_LE(p_colr_header_data,&jp2->meth,1);
      pOStack_20 = pOStack_20 + 1;
      opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)(p_colr_header_data_local + 0x40),1);
      pOStack_20 = pOStack_20 + 1;
      opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)(p_colr_header_data_local + 0x38),1);
      pOStack_20 = pOStack_20 + 1;
      if (*(int *)(p_colr_header_data_local + 0x34) == 1) {
        if (p_manager_local._4_4_ < 7) {
          opj_event_msg(poStack_30,1,"Bad COLR header box (bad size: %d)\n",
                        (ulong)p_manager_local._4_4_);
          return 0;
        }
        if ((7 < p_manager_local._4_4_) && (*(int *)(p_colr_header_data_local + 0x3c) != 0xe)) {
          opj_event_msg(poStack_30,2,"Bad COLR header box (bad size: %d)\n",
                        (ulong)p_manager_local._4_4_);
        }
        opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)(p_colr_header_data_local + 0x3c),4);
        pOStack_20 = pOStack_20 + 4;
        if (*(int *)(p_colr_header_data_local + 0x3c) == 0xe) {
          _ol = (undefined4 *)opj_malloc(0x24);
          if (_ol == (undefined4 *)0x0) {
            opj_event_msg(poStack_30,1,"Not enough memory for cielab\n");
            return 0;
          }
          *_ol = 0xe;
          it_icc_value = 0;
          ob = 0;
          oa = 0;
          il = 0;
          rb = 0;
          ra = 0;
          icc_len = 0x443530;
          _ol[1] = 0x44454600;
          if (p_manager_local._4_4_ == 0x23) {
            opj_read_bytes_LE(pOStack_20,&ra,4);
            pOStack_20 = pOStack_20 + 4;
            opj_read_bytes_LE(pOStack_20,&oa,4);
            pOStack_20 = pOStack_20 + 4;
            opj_read_bytes_LE(pOStack_20,&rb,4);
            pOStack_20 = pOStack_20 + 4;
            opj_read_bytes_LE(pOStack_20,&ob,4);
            pOStack_20 = pOStack_20 + 4;
            opj_read_bytes_LE(pOStack_20,&il,4);
            pOStack_20 = pOStack_20 + 4;
            opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)&it_icc_value,4);
            pOStack_20 = pOStack_20 + 4;
            opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)&icc_len,4);
            _ol[1] = 0;
          }
          else if (p_manager_local._4_4_ != 7) {
            opj_event_msg(poStack_30,2,"Bad COLR header box (CIELab, bad size: %d)\n",
                          (ulong)p_manager_local._4_4_);
          }
          _ol[2] = ra;
          _ol[4] = rb;
          _ol[6] = il;
          _ol[3] = oa;
          _ol[5] = ob;
          _ol[7] = it_icc_value;
          _ol[8] = icc_len;
          *(undefined4 **)(p_colr_header_data_local + 0x80) = _ol;
          p_colr_header_data_local[0x88] = '\0';
          p_colr_header_data_local[0x89] = '\0';
          p_colr_header_data_local[0x8a] = '\0';
          p_colr_header_data_local[0x8b] = '\0';
        }
        p_colr_header_data_local[0xa0] = '\x01';
      }
      else if (*(int *)(p_colr_header_data_local + 0x34) == 2) {
        iVar1 = p_manager_local._4_4_ - 3;
        *(int *)(p_colr_header_data_local + 0x88) = iVar1;
        pvVar2 = opj_calloc(1,(long)iVar1);
        *(void **)(p_colr_header_data_local + 0x80) = pvVar2;
        if (*(long *)(p_colr_header_data_local + 0x80) == 0) {
          p_colr_header_data_local[0x88] = '\0';
          p_colr_header_data_local[0x89] = '\0';
          p_colr_header_data_local[0x8a] = '\0';
          p_colr_header_data_local[0x8b] = '\0';
          return 0;
        }
        for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
          opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&cielab + 4),1);
          pOStack_20 = pOStack_20 + 1;
          *(char *)(*(long *)(p_colr_header_data_local + 0x80) + (long)local_60) =
               (char)cielab._4_4_;
        }
        p_colr_header_data_local[0xa0] = '\x01';
      }
      else if (2 < *(uint *)(p_colr_header_data_local + 0x34)) {
        opj_event_msg(poStack_30,4,
                      "COLR BOX meth value is not a regular value (%d), so we will ignore the entire Colour Specification box. \n"
                      ,(ulong)*(uint *)(p_colr_header_data_local + 0x34));
      }
      if (p_colr_header_data_local[0xa0] != '\0') {
        *(undefined4 *)(*(long *)p_colr_header_data_local + 0x148) =
             *(undefined4 *)(p_colr_header_data_local + 0x3c);
      }
      jp2_local._4_4_ = 1;
    }
    else {
      opj_event_msg(p_manager,4,
                    "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n"
                   );
      jp2_local._4_4_ = 1;
    }
    return jp2_local._4_4_;
  }
  __assert_fail("p_colr_header_data != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x5bc,
                "OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *jp2,
                                  OPJ_BYTE * p_colr_header_data,
                                  OPJ_UINT32 p_colr_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_value;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_colr_header_data != 00);
    assert(p_manager != 00);

    if (p_colr_header_size < 3) {
        opj_event_msg(p_manager, EVT_ERROR, "Bad COLR header box (bad size)\n");
        return OPJ_FALSE;
    }

    /* Part 1, I.5.3.3 : 'A conforming JP2 reader shall ignore all Colour
     * Specification boxes after the first.'
    */
    if (jp2->color.jp2_has_colr) {
        opj_event_msg(p_manager, EVT_INFO,
                      "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n");
        p_colr_header_data += p_colr_header_size;
        return OPJ_TRUE;
    }

    opj_read_bytes(p_colr_header_data, &jp2->meth, 1);          /* METH */
    ++p_colr_header_data;

    opj_read_bytes(p_colr_header_data, &jp2->precedence, 1);    /* PRECEDENCE */
    ++p_colr_header_data;

    opj_read_bytes(p_colr_header_data, &jp2->approx, 1);        /* APPROX */
    ++p_colr_header_data;

    if (jp2->meth == 1) {
        if (p_colr_header_size < 7) {
            opj_event_msg(p_manager, EVT_ERROR, "Bad COLR header box (bad size: %d)\n",
                          p_colr_header_size);
            return OPJ_FALSE;
        }
        if ((p_colr_header_size > 7) &&
                (jp2->enumcs != 14)) { /* handled below for CIELab) */
            /* testcase Altona_Technical_v20_x4.pdf */
            opj_event_msg(p_manager, EVT_WARNING, "Bad COLR header box (bad size: %d)\n",
                          p_colr_header_size);
        }

        opj_read_bytes(p_colr_header_data, &jp2->enumcs, 4);        /* EnumCS */

        p_colr_header_data += 4;

        if (jp2->enumcs == 14) { /* CIELab */
            OPJ_UINT32 *cielab;
            OPJ_UINT32 rl, ol, ra, oa, rb, ob, il;

            cielab = (OPJ_UINT32*)opj_malloc(9 * sizeof(OPJ_UINT32));
            if (cielab == NULL) {
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory for cielab\n");
                return OPJ_FALSE;
            }
            cielab[0] = 14; /* enumcs */

            /* default values */
            rl = ra = rb = ol = oa = ob = 0;
            il = 0x00443530; /* D50 */
            cielab[1] = 0x44454600;/* DEF */

            if (p_colr_header_size == 35) {
                opj_read_bytes(p_colr_header_data, &rl, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &ol, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &ra, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &oa, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &rb, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &ob, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &il, 4);
                p_colr_header_data += 4;

                cielab[1] = 0;
            } else if (p_colr_header_size != 7) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Bad COLR header box (CIELab, bad size: %d)\n", p_colr_header_size);
            }
            cielab[2] = rl;
            cielab[4] = ra;
            cielab[6] = rb;
            cielab[3] = ol;
            cielab[5] = oa;
            cielab[7] = ob;
            cielab[8] = il;

            jp2->color.icc_profile_buf = (OPJ_BYTE*)cielab;
            jp2->color.icc_profile_len = 0;
        }
        jp2->color.jp2_has_colr = 1;
    } else if (jp2->meth == 2) {
        /* ICC profile */
        OPJ_INT32 it_icc_value = 0;
        OPJ_INT32 icc_len = (OPJ_INT32)p_colr_header_size - 3;

        jp2->color.icc_profile_len = (OPJ_UINT32)icc_len;
        jp2->color.icc_profile_buf = (OPJ_BYTE*) opj_calloc(1, (size_t)icc_len);
        if (!jp2->color.icc_profile_buf) {
            jp2->color.icc_profile_len = 0;
            return OPJ_FALSE;
        }

        for (it_icc_value = 0; it_icc_value < icc_len; ++it_icc_value) {
            opj_read_bytes(p_colr_header_data, &l_value, 1);    /* icc values */
            ++p_colr_header_data;
            jp2->color.icc_profile_buf[it_icc_value] = (OPJ_BYTE) l_value;
        }

        jp2->color.jp2_has_colr = 1;
    } else if (jp2->meth > 2) {
        /*  ISO/IEC 15444-1:2004 (E), Table I.9 Legal METH values:
        conforming JP2 reader shall ignore the entire Colour Specification box.*/
        opj_event_msg(p_manager, EVT_INFO,
                      "COLR BOX meth value is not a regular value (%d), "
                      "so we will ignore the entire Colour Specification box. \n", jp2->meth);
    }
    if (jp2->color.jp2_has_colr) {
        jp2->j2k->enumcs = jp2->enumcs;
    }
    return OPJ_TRUE;
}